

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool __thiscall TestETCaptureCoverageInternal::Run(TestETCaptureCoverageInternal *this)

{
  Outputter *pOVar1;
  Cons<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<bool,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>_>
  *t;
  string local_b0;
  undefined8 local_90;
  undefined8 local_88;
  undefined4 local_80 [2];
  testinator local_78 [8];
  char *local_70;
  undefined4 local_68;
  char *local_60;
  testinator *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  undefined4 *local_38;
  char *local_30;
  
  local_38 = local_80;
  local_90 = 0x100000000;
  local_88 = 0x400000002;
  local_80[0] = 0;
  pOVar1 = (this->super_Test).m_op;
  local_58 = local_78;
  local_70 = 
  "EXPECT FAILED: /workspace/llm4binary/github/license_c_cmakelists/elbeno[P]testinator/src/test/main.cpp:"
  ;
  local_68 = 0x2a8;
  local_60 = " (1+2 > 1+3 < 0 => ";
  local_50 = " ";
  local_48 = "<";
  local_40 = " ";
  local_30 = ")";
  testinator::
  Diagnostic<testinator::Cons<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,char_const*>,int>,char_const*>,testinator::stringifier_select<int,testinator::default_formatter,testinator::detail::is_outputtable_tag>>,char_const*>,char_const*>,char_const*>,testinator::stringifier_select<int,testinator::default_formatter,testinator::detail::is_outputtable_tag>>,char_const*>>>
            (&local_b0,local_78,
             (Cons<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<int,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>,_const_char_*>,_const_char_*>,_testinator::stringifier_select<int,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>_>
              *)0x16057a);
  (*pOVar1->_vptr_Outputter[3])(pOVar1,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  (this->super_Test).m_success = false;
  pOVar1 = (this->super_Test).m_op;
  local_70 = 
  "EXPECT FAILED: /workspace/llm4binary/github/license_c_cmakelists/elbeno[P]testinator/src/test/main.cpp:"
  ;
  local_68 = 0x2a9;
  local_60 = " (false => ";
  local_58 = (testinator *)((ulong)local_58 & 0xffffffffffffff00);
  local_50 = ")";
  testinator::
  Diagnostic<testinator::Cons<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,char_const*>,int>,char_const*>,testinator::stringifier_select<bool,testinator::default_formatter,testinator::detail::is_outputtable_tag>>,char_const*>>>
            (&local_b0,local_78,t);
  (*pOVar1->_vptr_Outputter[3])(pOVar1,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  (this->super_Test).m_success = false;
  return true;
}

Assistant:

virtual bool Run()
  {
    EXPECT(1+2 > 1+3 < 0);
    EXPECT(false);
    return true;
  }